

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detection.cpp
# Opt level: O2

void __thiscall ncnn::Yolov3Detection::~Yolov3Detection(Yolov3Detection *this)

{
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Yolov3Detection_0017eb90;
  if (this->softmax != (Layer *)0x0) {
    (*this->softmax->_vptr_Layer[1])();
    this->softmax = (Layer *)0x0;
  }
  if (this->sigmoid != (Layer *)0x0) {
    (*this->sigmoid->_vptr_Layer[1])();
    this->sigmoid = (Layer *)0x0;
  }
  Mat::~Mat(&this->biases);
  Layer::~Layer(&this->super_Layer);
  return;
}

Assistant:

Yolov3Detection::~Yolov3Detection()
{
    if (NULL != softmax)
    {
        delete softmax;
        softmax = NULL;
    }

    if (NULL != sigmoid)
    {
        delete sigmoid;
        sigmoid = NULL;
    }
}